

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLEVER.cpp
# Opt level: O0

void __thiscall
CLEVER::addAlignment
          (CLEVER *this,
          unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> *alignment_autoptr,
          int *edgecounter,int *nonEdgeCounter,int numGCAllowedPos,int ct)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  pointer ppVar4;
  _Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_long>_> this_00;
  reference ppCVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *appearanceMap;
  size_type sVar6;
  Clique *pCVar7;
  size_type sVar8;
  reference ppCVar9;
  size_t sVar10;
  size_t sVar11;
  value_type *ppCVar12;
  int *in_RCX;
  undefined1 uVar13;
  int *in_RDX;
  long in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  pair<int,_unsigned_long> pVar14;
  pair<std::_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_long>_>,_bool> pVar15;
  size_t i_1;
  Clique *clique_j;
  size_t j;
  Clique *clique_i;
  size_t i;
  Clique *split_off_clique;
  unique_ptr<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  intersection;
  Clique *clique;
  vector<Clique_*,_std::allocator<Clique_*>_> new_cliques;
  iterator clique_it;
  bool set_edge;
  AlignmentRecord *alignment2;
  iterator_t end;
  iterator_t it;
  alignment_set_t adjacent;
  size_t index;
  AlignmentRecord *alignment;
  alignment_id_t id;
  pointer in_stack_fffffffffffffd88;
  Clique *in_stack_fffffffffffffd90;
  const_iterator in_stack_fffffffffffffd98;
  value_type *__x;
  Clique *in_stack_fffffffffffffda0;
  Clique *this_01;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffdc8;
  Clique *in_stack_fffffffffffffdd0;
  CliqueFinder *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde8;
  LogWriter *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffe38;
  value_type *local_168;
  size_type local_158;
  size_type local_148;
  _List_const_iterator<Clique_*> local_130;
  _List_node_base *local_128;
  _List_const_iterator<Clique_*> local_110;
  _List_node_base *local_108;
  CLEVER *in_stack_ffffffffffffff00;
  _Self local_f8;
  vector<Clique_*,_std::allocator<Clique_*>_> local_f0;
  _Self local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8;
  undefined4 local_bc;
  pair<int,_unsigned_long> local_b8;
  pair<unsigned_int,_unsigned_long> local_a8;
  byte local_91;
  AlignmentRecord *local_90;
  _Self local_88;
  _Self local_80 [8];
  long local_40;
  pointer local_38;
  alignment_id_t local_2c;
  undefined4 local_28;
  undefined4 local_24;
  int *local_20;
  int *local_18;
  
  local_2c = *(alignment_id_t *)(in_RDI + 0x38);
  *(alignment_id_t *)(in_RDI + 0x38) = local_2c + 1;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_38 = std::unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_>::release
                       ((unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> *)
                        0x24b496);
  AlignmentRecord::setID(local_38,local_2c);
  if (*(long *)(in_RDI + 0x28) == *(long *)(in_RDI + 0x40)) {
    reorganize_storage(in_stack_ffffffffffffff00);
  }
  local_40 = *(long *)(in_RDI + 0x28);
  *(long *)(in_RDI + 0x28) = local_40 + 1;
  *(pointer *)(*(long *)(in_RDI + 0x48) + local_40 * 8) = local_38;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x24b528);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffffdb0,CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8)
             ,(unsigned_long)in_stack_fffffffffffffda0,
             (allocator<unsigned_long> *)in_stack_fffffffffffffd98._M_node);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x24b558);
  local_80[0]._M_node =
       (_Base_ptr)
       std::
       set<std::pair<unsigned_int,_unsigned_long>,_std::less<std::pair<unsigned_int,_unsigned_long>_>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
       ::begin((set<std::pair<unsigned_int,_unsigned_long>,_std::less<std::pair<unsigned_int,_unsigned_long>_>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                *)in_stack_fffffffffffffd88);
  local_88._M_node =
       (_Base_ptr)
       std::
       set<std::pair<unsigned_int,_unsigned_long>,_std::less<std::pair<unsigned_int,_unsigned_long>_>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
       ::end((set<std::pair<unsigned_int,_unsigned_long>,_std::less<std::pair<unsigned_int,_unsigned_long>_>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
              *)in_stack_fffffffffffffd88);
  while (bVar2 = std::operator!=(local_80,&local_88), bVar2) {
    lVar1 = *(long *)(in_RDI + 0x48);
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_long>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_long>_> *)0x24b5c9
                       );
    local_90 = *(AlignmentRecord **)(lVar1 + ppVar4->second * 8);
    local_91 = (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                         (*(long **)(in_RDI + 8),local_38,local_90,local_24,local_28);
    local_91 = local_91 & 1;
    if ((local_91 != 0) && (*(long *)(in_RDI + 0x30) != 0)) {
      local_91 = (**(code **)(**(long **)(in_RDI + 0x30) + 0x10))
                           (*(long **)(in_RDI + 0x30),local_38,local_90,local_24,local_28);
      local_91 = local_91 & 1;
    }
    if (local_91 == 0) {
      *local_20 = *local_20 + 1;
    }
    else {
      *local_18 = *local_18 + 1;
      std::_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_long>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_long>_> *)0x24b709);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffda0,(size_type)in_stack_fffffffffffffd98._M_node,
                 SUB81((ulong)in_stack_fffffffffffffd90 >> 0x38,0));
      if (*(long *)(in_RDI + 0x50) != 0) {
        AlignmentRecord::getID(local_38);
        AlignmentRecord::getID(local_90);
        LogWriter::reportEdge
                  (in_stack_fffffffffffffdf0,(uint)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                   (uint)in_stack_fffffffffffffde8);
      }
      *(undefined1 *)(in_RDI + 0x19) = 0;
    }
    std::_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_long>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_long>_> *)
               in_stack_fffffffffffffd90);
  }
  local_bc = 0;
  pVar14 = std::make_pair<int,unsigned_long&>
                     ((int *)in_stack_fffffffffffffd90,(unsigned_long *)in_stack_fffffffffffffd88);
  local_b8.second = pVar14.second;
  local_b8.first = pVar14.first;
  std::pair<unsigned_int,_unsigned_long>::pair<int,_unsigned_long,_true>(&local_a8,&local_b8);
  pVar15 = std::
           set<std::pair<unsigned_int,_unsigned_long>,_std::less<std::pair<unsigned_int,_unsigned_long>_>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ::insert((set<std::pair<unsigned_int,_unsigned_long>,_std::less<std::pair<unsigned_int,_unsigned_long>_>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                     *)in_stack_fffffffffffffdb0,
                    (value_type *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
  this_00 = pVar15.first._M_node;
  uVar13 = pVar15.second;
  local_d0 = this_00._M_node;
  local_c8 = uVar13;
  local_d8._M_node =
       (_List_node_base *)
       std::__cxx11::list<Clique_*,_std::allocator<Clique_*>_>::begin
                 ((list<Clique_*,_std::allocator<Clique_*>_> *)in_stack_fffffffffffffd88);
  std::vector<Clique_*,_std::allocator<Clique_*>_>::vector
            ((vector<Clique_*,_std::allocator<Clique_*>_> *)0x24b8a4);
  while( true ) {
    local_f8._M_node =
         (_List_node_base *)
         std::__cxx11::list<Clique_*,_std::allocator<Clique_*>_>::end
                   ((list<Clique_*,_std::allocator<Clique_*>_> *)in_stack_fffffffffffffd88);
    bVar2 = std::operator!=(&local_d8,&local_f8);
    if (!bVar2) break;
    ppCVar5 = std::_List_iterator<Clique_*>::operator*((_List_iterator<Clique_*> *)0x24b8e8);
    pCVar7 = *ppCVar5;
    appearanceMap =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)Clique::rightmostSegmentEnd(pCVar7);
    uVar3 = AlignmentRecord::getIntervalStart(local_38);
    if (appearanceMap <
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)(ulong)uVar3) {
      std::_List_const_iterator<Clique_*>::_List_const_iterator(&local_110,&local_d8);
      local_108 = (_List_node_base *)
                  std::__cxx11::list<Clique_*,_std::allocator<Clique_*>_>::erase
                            ((list<Clique_*,_std::allocator<Clique_*>_> *)in_stack_fffffffffffffd90,
                             in_stack_fffffffffffffd98);
      local_d8._M_node = local_108;
      std::unique_ptr<Clique,std::default_delete<Clique>>::
      unique_ptr<std::default_delete<Clique>,void>
                ((unique_ptr<Clique,_std::default_delete<Clique>_> *)in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffd88);
      CliqueCollector::add
                ((CliqueCollector *)this_00._M_node,
                 (unique_ptr<Clique,_std::default_delete<Clique>_> *)
                 CONCAT17(uVar13,in_stack_fffffffffffffe38),appearanceMap);
      std::unique_ptr<Clique,_std::default_delete<Clique>_>::~unique_ptr
                ((unique_ptr<Clique,_std::default_delete<Clique>_> *)in_stack_fffffffffffffd90);
    }
    else {
      Clique::intersect((Clique *)in_stack_fffffffffffffdd8,
                        (alignment_set_t *)in_stack_fffffffffffffdd0);
      std::
      unique_ptr<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator->((unique_ptr<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)0x24ba67);
      bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffd98._M_node);
      if (bVar2) {
        std::
        unique_ptr<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::operator->((unique_ptr<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)0x24ba95);
        sVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffda0);
        sVar10 = Clique::size(pCVar7);
        if (sVar6 == sVar10) {
          Clique::add(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          std::vector<Clique_*,_std::allocator<Clique_*>_>::push_back
                    ((vector<Clique_*,_std::allocator<Clique_*>_> *)in_stack_fffffffffffffda0,
                     (value_type *)in_stack_fffffffffffffd98._M_node);
          std::_List_const_iterator<Clique_*>::_List_const_iterator(&local_130,&local_d8);
          local_128 = (_List_node_base *)
                      std::__cxx11::list<Clique_*,_std::allocator<Clique_*>_>::erase
                                ((list<Clique_*,_std::allocator<Clique_*>_> *)
                                 in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
          local_d8._M_node = local_128;
        }
        else {
          operator_new(0x30);
          Clique::Clique(in_stack_fffffffffffffda0,(CliqueFinder *)in_stack_fffffffffffffd98._M_node
                         ,(unique_ptr<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)in_stack_fffffffffffffd90);
          Clique::add(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          std::vector<Clique_*,_std::allocator<Clique_*>_>::push_back
                    ((vector<Clique_*,_std::allocator<Clique_*>_> *)in_stack_fffffffffffffda0,
                     (value_type *)in_stack_fffffffffffffd98._M_node);
          std::_List_iterator<Clique_*>::operator++(&local_d8);
        }
      }
      else {
        std::_List_iterator<Clique_*>::operator++(&local_d8);
      }
      std::
      unique_ptr<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~unique_ptr((unique_ptr<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     *)in_stack_fffffffffffffda0);
    }
  }
  sVar6 = std::vector<Clique_*,_std::allocator<Clique_*>_>::size(&local_f0);
  if (sVar6 == 0) {
    pCVar7 = (Clique *)operator_new(0x30);
    Clique::Clique(pCVar7,in_stack_fffffffffffffdd8,(size_t)in_stack_fffffffffffffdd0,
                   in_stack_fffffffffffffdc8);
    std::vector<Clique_*,_std::allocator<Clique_*>_>::push_back
              ((vector<Clique_*,_std::allocator<Clique_*>_> *)in_stack_fffffffffffffd90,
               (value_type *)in_stack_fffffffffffffd88);
  }
  local_148 = 0;
  do {
    sVar6 = local_148;
    sVar8 = std::vector<Clique_*,_std::allocator<Clique_*>_>::size(&local_f0);
    if (sVar8 <= sVar6) {
      local_168 = (value_type *)0x0;
      while (__x = local_168,
            ppCVar12 = (value_type *)
                       std::vector<Clique_*,_std::allocator<Clique_*>_>::size(&local_f0),
            __x < ppCVar12) {
        ppCVar9 = std::vector<Clique_*,_std::allocator<Clique_*>_>::operator[]
                            (&local_f0,(size_type)local_168);
        if (*ppCVar9 != (value_type)0x0) {
          std::vector<Clique_*,_std::allocator<Clique_*>_>::operator[]
                    (&local_f0,(size_type)local_168);
          std::__cxx11::list<Clique_*,_std::allocator<Clique_*>_>::push_back
                    ((list<Clique_*,_std::allocator<Clique_*>_> *)in_stack_fffffffffffffda0,__x);
        }
        local_168 = (value_type *)((long)local_168 + 1);
      }
      std::vector<Clique_*,_std::allocator<Clique_*>_>::~vector
                ((vector<Clique_*,_std::allocator<Clique_*>_> *)in_stack_fffffffffffffda0);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x24bfa4);
      return;
    }
    ppCVar9 = std::vector<Clique_*,_std::allocator<Clique_*>_>::operator[](&local_f0,local_148);
    if (*ppCVar9 != (value_type)0x0) {
      ppCVar9 = std::vector<Clique_*,_std::allocator<Clique_*>_>::operator[](&local_f0,local_148);
      pCVar7 = *ppCVar9;
      local_158 = local_148;
      do {
        while( true ) {
          do {
            local_158 = local_158 + 1;
            sVar6 = local_158;
            sVar8 = std::vector<Clique_*,_std::allocator<Clique_*>_>::size(&local_f0);
            if (sVar8 <= sVar6) goto LAB_0024bed1;
            ppCVar9 = std::vector<Clique_*,_std::allocator<Clique_*>_>::operator[]
                                (&local_f0,local_158);
          } while (*ppCVar9 == (value_type)0x0);
          ppCVar9 = std::vector<Clique_*,_std::allocator<Clique_*>_>::operator[]
                              (&local_f0,local_158);
          this_01 = *ppCVar9;
          sVar10 = Clique::size(pCVar7);
          sVar11 = Clique::size(this_01);
          if (sVar10 <= sVar11) break;
          bVar2 = Clique::contains(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
          if (bVar2) {
            if (this_01 != (Clique *)0x0) {
              (*this_01->_vptr_Clique[1])();
            }
            ppCVar9 = std::vector<Clique_*,_std::allocator<Clique_*>_>::operator[]
                                (&local_f0,local_158);
            *ppCVar9 = (value_type)0x0;
            in_stack_fffffffffffffda0 = this_01;
          }
        }
        bVar2 = Clique::contains(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      } while (!bVar2);
      if (pCVar7 != (Clique *)0x0) {
        (*pCVar7->_vptr_Clique[1])();
      }
      ppCVar9 = std::vector<Clique_*,_std::allocator<Clique_*>_>::operator[](&local_f0,local_148);
      *ppCVar9 = (value_type)0x0;
    }
LAB_0024bed1:
    local_148 = local_148 + 1;
  } while( true );
}

Assistant:

void CLEVER::addAlignment(std::unique_ptr<AlignmentRecord>& alignment_autoptr, int& edgecounter, int& nonEdgeCounter, int numGCAllowedPos, int ct) {
    assert(alignment_autoptr.get() != 0);
	assert(cliques!=0);
    assert(initialized);

	alignment_id_t id = next_id++;
	AlignmentRecord* alignment = alignment_autoptr.release();
	alignment->setID(id);

	// store new alignment
	if (alignment_count==capacity) {
		reorganize_storage();
	}
	size_t index = alignment_count++;
	alignments[index] = alignment;

	// TODO: Once edge criteria are fixed, we can try to (re-)gain some efficiency here...
// 	if (single_end) {
		
// 	} else {
// 		alignments_by_length.insert(make_pair(alignment->getInsertLength(), index));
// 	}
	// determine all edges from current alignment pair
	alignment_set_t adjacent(capacity);
	// determine range of insert lengths to be searched
	typedef set<length_and_index_t>::const_iterator iterator_t;
	iterator_t it = alignments_by_length.begin();
	iterator_t end = alignments_by_length.end();
	// iterate through all alignments
	for (; it!=end; ++it) {
		const AlignmentRecord* alignment2 = alignments[it->second];

        //if(alignment->getName().find("normal14") != string::npos && alignment2->getName().find("normal14") != string::npos){
        //       int k = 0;
        //}
		// cerr << "  comparing to " << alignments[it->second]->getID() << ", length " << it->first << ", read group: " << alignments[it->second]->getReadGroup();
        bool set_edge = edge_calculator.edgeBetween(*alignment, *alignment2,numGCAllowedPos,ct);
        //if(a1.getName().find("Clique") != string::npos && a2.getName().find("Clique") != string::npos){
        //FOR DEBUGGING
        //}
        if (set_edge && (second_edge_calculator != nullptr)) {
            set_edge = second_edge_calculator->edgeBetween(*alignment,*alignment2,numGCAllowedPos,ct);
		}
		if (set_edge) {
            edgecounter++;
            //cout << "Edge: " << alignment->getName() << " and " << alignment2->getName() << endl;
			adjacent.set(it->second, true);
			// cerr << " --> EDGE";
			if (lw != nullptr) {
                lw->reportEdge(alignment->getID(), alignment2->getID());
            }
            converged = false;
        }else{
            nonEdgeCounter++;
        }
		// cerr << endl;
	}

    alignments_by_length.insert(make_pair(0, index));

	// iterate over all active cliques. output those that lie left of current segment and
	// check intersection with current node for the rest
	clique_list_t::iterator clique_it = cliques->begin();
	// cliques that contain the newly added alignment and
	// therefore need to be checked for subset relations,
	// i.e. if one of these cliques is contained in another,
	// it must be discarded as it is not maximal.
	vector<Clique*> new_cliques;
	while (clique_it!=cliques->end()) {
		Clique* clique = *clique_it;
		if (clique->rightmostSegmentEnd() < alignment->getIntervalStart()) {
			clique_it = cliques->erase(clique_it);
            clique_collector.add(unique_ptr<Clique>(clique),this->appearanceMap);
		} else {
			// is there an intersection between nodes adjacent to the new
			// alignment and the currently considered clique?
			unique_ptr<alignment_set_t> intersection = clique->intersect(adjacent);
			if (intersection->any()) {
				// is node adjacent to all nodes in the clique?
				if (intersection->count() == clique->size()) {
					// cout << "   Adding to clique " << (*clique) << endl;
					clique->add(index);
					new_cliques.push_back(clique);
					clique_it = cliques->erase(clique_it);
				} else {
					Clique* split_off_clique = new Clique(*this, intersection);
					split_off_clique->add(index);
					// cout << "   Splitting off clique " << (*clique) << " --> " << (*split_off_clique) << endl;
					new_cliques.push_back(split_off_clique);
					++clique_it;
				}
			} else {
				// cout << "   Empty intersection for clique " << (*clique) << endl;
				++clique_it;
			}
		}
	}
	// if current alignment has not been assigned to at least one
	// of the existing cliques, let it form its own singleton clique
	if (new_cliques.size() == 0) {
		new_cliques.push_back(new Clique(*this, index, capacity));
	}

	// check for subset relations and delete cliques that are subsets of others
	for (size_t i=0; i<new_cliques.size(); ++i) {
		if (new_cliques[i]==0) continue;
		Clique* clique_i = new_cliques[i];
		for (size_t j=i+1; j<new_cliques.size(); ++j) {
			if (new_cliques[j]==0) continue;
			Clique* clique_j = new_cliques[j];
			if (clique_i->size()<=clique_j->size()) {
				if (clique_j->contains(*clique_i)) {
					// cout << "Removing duplicate or non-maximal clique!" << endl;
					delete clique_i;
					new_cliques[i] = nullptr;
					break;
				}
			} else {
				if (clique_i->contains(*clique_j)) {
					// cout << "Removing duplicate or non-maximal clique!" << endl;
					delete clique_j;
					new_cliques[j] = nullptr;
					continue;
				}
			}
		}
	}
	//double cpu_time = (double) (clock() - clock_start) / CLOCKS_PER_SEC;
	//int clique_size_new = 0;
	for (size_t i=0; i<new_cliques.size(); ++i) {
		if (new_cliques[i]!=nullptr) {
			cliques->push_back(new_cliques[i]);
			//clique_size_new++;
		}
	}

	//cout << cliques->size() << "\t" << alignment_count << "\t" << clique_size_old << "\t" << clique_size_new << "\t" << cpu_time << "\t" << no_sort << endl;
    /*cout << "  Current Alignments: ";
	for (size_t i=0; i<alignment_count; ++i) {
		cout << alignments[i]->getID() << " ";
	}
	cout << endl;
	cout << "  Current cliques:"<<  endl;
	for (clique_it = cliques->begin();clique_it!=cliques->end(); ++clique_it) {
		cout << "    " << **clique_it << endl;
    }*/

}